

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

string * license::normalize_project_path(string *__return_storage_ptr__,string *project_path)

{
  bool bVar1;
  logic_error *this;
  string *psVar2;
  path local_1b0;
  path local_190;
  path local_170;
  path local_150;
  path local_130;
  path local_110;
  path local_f0;
  string local_d0 [8];
  string rproject_path_str;
  path normalized;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  path rproject_path;
  string *project_path_local;
  
  rproject_path.m_pathname.field_2._8_8_ = project_path;
  boost::filesystem::path::path((path *)local_38,project_path);
  bVar1 = boost::filesystem::exists((path *)local_38);
  if ((bVar1) && (bVar1 = boost::filesystem::is_directory((path *)local_38), bVar1)) {
    boost::filesystem::path::path((path *)((long)&rproject_path_str.field_2 + 8));
    psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_38);
    std::__cxx11::string::string(local_d0,(string *)psVar2);
    psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_38);
    bVar1 = std::operator==(psVar2,".");
    if (bVar1) {
      boost::filesystem::current_path();
      boost::filesystem::path::operator=((path *)((long)&rproject_path_str.field_2 + 8),&local_f0);
      boost::filesystem::path::~path(&local_f0);
      boost::filesystem::current_path();
      boost::filesystem::operator/(&local_130,&local_150,(path *)local_38);
      boost::filesystem::current_path();
      boost::filesystem::canonical(&local_110,&local_130,&local_170);
      boost::filesystem::path::operator=((path *)((long)&rproject_path_str.field_2 + 8),&local_110);
      boost::filesystem::path::~path(&local_110);
      boost::filesystem::path::~path(&local_170);
      boost::filesystem::path::~path(&local_130);
      boost::filesystem::path::~path(&local_150);
    }
    else {
      boost::filesystem::current_path();
      boost::filesystem::canonical(&local_190,(path *)local_38,&local_1b0);
      boost::filesystem::path::operator=((path *)((long)&rproject_path_str.field_2 + 8),&local_190);
      boost::filesystem::path::~path(&local_190);
      boost::filesystem::path::~path(&local_1b0);
    }
    psVar2 = boost::filesystem::path::string_abi_cxx11_
                       ((path *)((long)&rproject_path_str.field_2 + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    std::__cxx11::string::~string(local_d0);
    boost::filesystem::path::~path((path *)((long)&rproject_path_str.field_2 + 8));
    boost::filesystem::path::~path((path *)local_38);
    return __return_storage_ptr__;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,"Path ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 rproject_path.m_pathname.field_2._8_8_);
  std::operator+(&local_68,&local_88," doesn\'t exist or is not a directory.");
  std::logic_error::logic_error(this,(string *)&local_68);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static const string normalize_project_path(const string &project_path) {
	const fs::path rproject_path(project_path);
	if (!fs::exists(rproject_path) || !fs::is_directory(rproject_path)) {
		throw logic_error("Path " + project_path + " doesn't exist or is not a directory.");
	}
	fs::path normalized;
	const string rproject_path_str = rproject_path.string();
	if (rproject_path.string() == ".") {
		normalized = fs::current_path();
		// sometimes is_relative fails under wine: a linux path is taken for a relative path.
		normalized = fs::canonical(fs::current_path() / rproject_path);
	} else {
		normalized = fs::canonical(rproject_path);
	}
	return normalized.string();
}